

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_format(lua_State *L)

{
  byte *__src;
  byte bVar1;
  ushort *puVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  byte *pbVar9;
  char *pcVar10;
  void *pvVar11;
  ushort **ppuVar12;
  lua_Integer lVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  lconv *plVar18;
  undefined1 *puVar19;
  byte *pbVar20;
  size_t sVar21;
  int arg;
  bool bVar22;
  lua_Number lVar23;
  size_t l;
  char form [32];
  size_t sfl;
  int local_20a0;
  size_t local_2098 [2];
  char local_2088;
  undefined1 local_2087;
  byte local_2086 [30];
  byte *local_2068;
  size_t local_2060;
  size_t local_2058;
  luaL_Buffer local_2050;
  
  iVar5 = lua_gettop(L);
  pbVar8 = (byte *)luaL_checklstring(L,1,&local_2058);
  luaL_buffinit(L,&local_2050);
  if (0 < (long)local_2058) {
    pbVar20 = pbVar8 + local_2058;
    iVar6 = 1;
    local_2068 = pbVar20;
    do {
      if (*pbVar8 != 0x25) {
        if (local_2050.size <= local_2050.n) {
          luaL_prepbuffsize(&local_2050,1);
        }
        pbVar9 = pbVar8 + 1;
LAB_0011d09f:
        local_2050.b[local_2050.n] = *pbVar8;
        local_2050.n = local_2050.n + 1;
        goto LAB_0011d2f5;
      }
      __src = pbVar8 + 1;
      if (pbVar8[1] == 0x25) {
        if (local_2050.size <= local_2050.n) {
          luaL_prepbuffsize(&local_2050,1);
        }
        pbVar9 = pbVar8 + 2;
        pbVar8 = __src;
        goto LAB_0011d09f;
      }
      pcVar10 = luaL_prepbuffsize(&local_2050,0x1ac);
      arg = iVar6 + 1;
      if (iVar5 <= iVar6) {
        luaL_argerror(L,arg,"no value");
      }
      bVar1 = *__src;
      pbVar9 = __src;
      while ((bVar1 != 0 && (pvVar11 = memchr("-+ #0",(int)(char)bVar1,6), pvVar11 != (void *)0x0)))
      {
        bVar1 = pbVar9[1];
        pbVar9 = pbVar9 + 1;
      }
      if (5 < (ulong)((long)pbVar9 - (long)__src)) {
        luaL_error(L,"invalid format (repeated flags)");
      }
      ppuVar12 = __ctype_b_loc();
      puVar2 = *ppuVar12;
      uVar17 = (ulong)(puVar2[*pbVar9] >> 0xb & 1);
      pbVar9 = pbVar9 + ((puVar2[pbVar9[uVar17]] >> 0xb & 1) != 0) + uVar17;
      if (*pbVar9 == 0x2e) {
        bVar22 = (*(byte *)((long)puVar2 + (ulong)pbVar9[1] * 2 + 1) & 8) == 0;
        pbVar8 = pbVar9 + 2;
        if (bVar22) {
          pbVar8 = pbVar9 + 1;
        }
        pbVar9 = pbVar8 + ((puVar2[pbVar9[2 - (ulong)bVar22]] >> 0xb & 1) != 0);
      }
      if ((*(byte *)((long)puVar2 + (ulong)*pbVar9 * 2 + 1) & 8) != 0) {
        luaL_error(L,"invalid format (width or precision too long)");
      }
      local_2088 = '%';
      memcpy(&local_2087,__src,(size_t)(pbVar9 + (1 - (long)__src)));
      pbVar9[(long)(local_2086 + -(long)__src)] = 0;
      bVar1 = *pbVar9;
      if (bVar1 < 0x58) {
        if (bVar1 != 0x41) {
          if ((bVar1 == 0x45) || (bVar1 == 0x47)) goto switchD_0011d20d_caseD_65;
          goto switchD_0011d20d_caseD_62;
        }
switchD_0011d20d_caseD_61:
        addlenmod(&local_2088,"");
        lVar23 = luaL_checknumber(L,arg);
LAB_0011d2c8:
        iVar6 = snprintf(pcVar10,0x1ac,&local_2088,lVar23);
        goto LAB_0011d2d1;
      }
      switch(bVar1) {
      case 0x61:
        goto switchD_0011d20d_caseD_61;
      case 0x62:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x70:
      case 0x72:
      case 0x74:
      case 0x76:
      case 0x77:
        goto switchD_0011d20d_caseD_62;
      case 99:
        uVar17 = luaL_checkinteger(L,arg);
        iVar6 = snprintf(pcVar10,0x1ac,&local_2088,uVar17 & 0xffffffff);
        break;
      case 100:
      case 0x69:
      case 0x6f:
      case 0x75:
      case 0x78:
switchD_0011d20d_caseD_64:
        lVar13 = luaL_checkinteger(L,arg);
        addlenmod(&local_2088,"ll");
        iVar6 = snprintf(pcVar10,0x1ac,&local_2088,lVar13);
        break;
      case 0x65:
      case 0x66:
      case 0x67:
switchD_0011d20d_caseD_65:
        lVar23 = luaL_checknumber(L,arg);
        addlenmod(&local_2088,"");
        goto LAB_0011d2c8;
      case 0x71:
        uVar7 = lua_type(L,arg);
        if (1 < uVar7) {
          if (uVar7 == 3) {
            pcVar10 = luaL_prepbuffsize(&local_2050,0x1ac);
            iVar6 = lua_isinteger(L,arg);
            if (iVar6 == 0) {
              lua_tonumberx(L,arg,(int *)0x0);
              iVar6 = snprintf(pcVar10,0x1ac,"%a");
              pvVar11 = memchr(pcVar10,0x2e,(long)iVar6);
              if (pvVar11 == (void *)0x0) {
                plVar18 = localeconv();
                puVar19 = (undefined1 *)memchr(pcVar10,(int)*plVar18->decimal_point,(long)iVar6);
                if (puVar19 != (undefined1 *)0x0) {
                  *puVar19 = 0x2e;
                }
              }
            }
            else {
              lVar13 = lua_tointegerx(L,arg,(int *)0x0);
              iVar6 = snprintf(pcVar10,0x1ac,"%lld",lVar13);
            }
            local_2050.n = local_2050.n + (long)iVar6;
          }
          else if (uVar7 == 4) {
            pcVar10 = lua_tolstring(L,arg,&local_2060);
            sVar4 = local_2060;
            if (local_2050.size <= local_2050.n) {
              luaL_prepbuffsize(&local_2050,1);
            }
            uVar17 = local_2050.n + 1;
            local_2050.b[local_2050.n] = '\"';
            local_2050.n = uVar17;
            if (sVar4 != 0) {
              sVar21 = 0;
              do {
                bVar1 = pcVar10[sVar21];
                if (((bVar1 == 10) || (bVar1 == 0x5c)) || (bVar1 == 0x22)) {
                  if (local_2050.size <= local_2050.n) {
                    luaL_prepbuffsize(&local_2050,1);
                  }
                  local_2050.b[local_2050.n] = '\\';
                  local_2050.n = local_2050.n + 1;
LAB_0011d3f5:
                  if (local_2050.size <= local_2050.n) {
                    luaL_prepbuffsize(&local_2050,1);
                  }
                  local_2050.b[local_2050.n] = pcVar10[sVar21];
                  local_2050.n = local_2050.n + 1;
                }
                else {
                  if (((*ppuVar12)[bVar1] & 2) == 0) goto LAB_0011d3f5;
                  pcVar14 = "\\%d";
                  if (((*ppuVar12)[(byte)pcVar10[sVar21 + 1]] >> 0xb & 1) != 0) {
                    pcVar14 = "\\%03d";
                  }
                  snprintf((char *)local_2098,10,pcVar14);
                  luaL_addstring(&local_2050,(char *)local_2098);
                }
                sVar21 = sVar21 + 1;
              } while (sVar4 != sVar21);
            }
            if (local_2050.size <= local_2050.n) {
              luaL_prepbuffsize(&local_2050,1);
            }
            local_2050.b[local_2050.n] = '\"';
            local_2050.n = local_2050.n + 1;
          }
          else {
            luaL_argerror(L,arg,"value has no literal form");
          }
          goto LAB_0011d668;
        }
        iVar6 = 0;
        luaL_tolstring(L,arg,(size_t *)0x0);
        luaL_addvalue(&local_2050);
        break;
      case 0x73:
        pcVar14 = luaL_tolstring(L,arg,local_2098);
        sVar3 = local_2098[0];
        if (local_2086[0] != 0) {
          sVar15 = strlen(pcVar14);
          if (sVar3 != sVar15) {
            luaL_argerror(L,arg,"string contains zeros");
          }
          pcVar16 = strchr(&local_2088,0x2e);
          if ((pcVar16 != (char *)0x0) || (local_2098[0] < 100)) {
            iVar6 = snprintf(pcVar10,0x1ac,&local_2088,pcVar14);
            lua_settop(L,-2);
            break;
          }
        }
        luaL_addvalue(&local_2050);
LAB_0011d668:
        iVar6 = 0;
        break;
      default:
        if (bVar1 == 0x58) goto switchD_0011d20d_caseD_64;
        goto switchD_0011d20d_caseD_62;
      }
LAB_0011d2d1:
      local_2050.n = local_2050.n + (long)iVar6;
      bVar22 = true;
LAB_0011d2e1:
      if (!bVar22) {
        return local_20a0;
      }
      pbVar9 = pbVar9 + 1;
      pbVar20 = local_2068;
      iVar6 = arg;
LAB_0011d2f5:
      pbVar8 = pbVar9;
    } while (pbVar9 < pbVar20);
  }
  luaL_pushresult(&local_2050);
  return 1;
switchD_0011d20d_caseD_62:
  bVar22 = false;
  local_20a0 = luaL_error(L,"invalid option \'%%%c\' to \'format\'",(ulong)(uint)(int)(char)bVar1);
  goto LAB_0011d2e1;
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      char *buff = luaL_prepbuffsize(&b, MAX_ITEM);  /* to put formatted item */
      int nb = 0;  /* number of bytes in added item */
      if (++arg > top)
        luaL_argerror(L, arg, "no value");
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          nb = l_sprintf(buff, MAX_ITEM, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
        case 'o': case 'u': case 'x': case 'X': {
          lua_Integer n = luaL_checkinteger(L, arg);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, MAX_ITEM, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, MAX_ITEM, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'e': case 'E': case 'f':
        case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, MAX_ITEM, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'q': {
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            if (!strchr(form, '.') && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, MAX_ITEM, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid option '%%%c' to 'format'",
                               *(strfrmt - 1));
        }
      }
      lua_assert(nb < MAX_ITEM);
      luaL_addsize(&b, nb);
    }
  }
  luaL_pushresult(&b);
  return 1;
}